

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckLowerCaseAttrValue(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Lexer *pLVar1;
  bool bVar2;
  Bool BVar3;
  tmbstr ptVar4;
  Lexer *lexer;
  char *pcStack_28;
  Bool hasUpper;
  tmbstr p;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar2 = false;
  if ((attval != (AttVal *)0x0) && (attval->value != (tmbstr)0x0)) {
    for (pcStack_28 = attval->value; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
      BVar3 = prvTidyIsUpper((int)*pcStack_28);
      if (BVar3 != no) {
        bVar2 = true;
        break;
      }
    }
    if (bVar2) {
      pLVar1 = doc->lexer;
      if (pLVar1->isvoyager != no) {
        prvTidyReportAttrError(doc,node,attval,0x226);
      }
      if ((pLVar1->isvoyager != no) || ((int)(doc->config).value[0x2e].v != 0)) {
        ptVar4 = prvTidytmbstrtolower(attval->value);
        attval->value = ptVar4;
      }
    }
  }
  return;
}

Assistant:

static void CheckLowerCaseAttrValue( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    Bool hasUpper = no;
    
    if (!AttrHasValue(attval))
        return;

    p = attval->value;
    
    while (*p)
    {
        if (TY_(IsUpper)(*p)) /* #501230 - fix by Terry Teague - 09 Jan 02 */
        {
            hasUpper = yes;
            break;
        }
        p++;
    }

    if (hasUpper)
    {
        Lexer* lexer = doc->lexer;
        if (lexer->isvoyager)
            TY_(ReportAttrError)( doc, node, attval, ATTR_VALUE_NOT_LCASE);
  
        if ( lexer->isvoyager || cfgBool(doc, TidyLowerLiterals) )
            attval->value = TY_(tmbstrtolower)(attval->value);
    }
}